

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall
QTableViewPrivate::sectionSpanEndLogical
          (QTableViewPrivate *this,QHeaderView *header,int logical,int span)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = QHeaderView::visualIndex(header,logical);
  if (1 < span) {
    iVar1 = iVar1 + 1;
    iVar2 = QHeaderView::count(header);
    if (iVar1 < iVar2) {
      iVar2 = span + -2;
      do {
        logical = QHeaderView::logicalIndex(header,iVar1);
        bVar4 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar4) {
          return logical;
        }
        iVar1 = iVar1 + 1;
        iVar3 = QHeaderView::count(header);
      } while (iVar1 < iVar3);
    }
  }
  return logical;
}

Assistant:

int QTableViewPrivate::sectionSpanEndLogical(const QHeaderView *header, int logical, int span) const
{
    int visual = header->visualIndex(logical);
    for (int i = 1; i < span; ) {
        if (++visual >= header->count())
            break;
        logical = header->logicalIndex(visual);
        ++i;
    }
    return logical;
}